

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  ulong uVar5;
  resolve_t rVar6;
  timediff_t tVar7;
  char *pcVar8;
  long lVar9;
  curltime cVar10;
  curltime newer;
  curltime older;
  Curl_dns_entry *local_38;
  
  uVar1 = *(uint *)&(conn->bits).field_0x4;
  if ((char)uVar1 < '\0') {
    *async = false;
  }
  else {
    if ((uVar1 & 0x20) == 0) {
      local_38 = (Curl_dns_entry *)0x0;
      tVar7 = Curl_timeleft(data,(curltime *)0x0,true);
      uVar1 = *(uint *)&(conn->bits).field_0x4;
      lVar9 = 0xb8;
      if ((uVar1 >> 9 & 1) == 0) {
        lVar9 = 0x88;
      }
      conn->port = *(int *)((long)&conn->remote_port + (ulong)(uVar1 >> 8 & 4));
      pcVar8 = (*Curl_cstrdup)(*(char **)((long)(&conn->chunk + -1) + lVar9));
      conn->hostname_resolve = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      rVar6 = Curl_resolv_timeout(data,pcVar8,conn->port,&local_38,tVar7);
      conn->dns_entry = local_38;
      if (rVar6 == CURLRESOLV_TIMEDOUT) {
        uVar2 = *(undefined8 *)((conn->chunk).hexbuffer + lVar9 + -0x25);
        cVar10 = Curl_now();
        uVar3 = (data->progress).t_startsingle.tv_sec;
        uVar4 = (data->progress).t_startsingle.tv_usec;
        older.tv_usec = uVar4;
        older.tv_sec = uVar3;
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar10._0_12_,0);
        newer.tv_usec = SUB124(cVar10._0_12_,8);
        older._12_4_ = 0;
        tVar7 = Curl_timediff(newer,older);
        Curl_failf(data,"Failed to resolve host \'%s\' with timeout after %ld ms",uVar2,tVar7);
        return CURLE_OPERATION_TIMEDOUT;
      }
      if (rVar6 != CURLRESOLV_PENDING) {
        if (local_38 == (Curl_dns_entry *)0x0) {
          Curl_failf(data,"Could not resolve host: %s",
                     *(undefined8 *)((conn->chunk).hexbuffer + lVar9 + -0x25));
          return CURLE_COULDNT_RESOLVE_HOST;
        }
        return CURLE_OK;
      }
    }
    else {
      local_38 = (Curl_dns_entry *)0x0;
      tVar7 = Curl_timeleft(data,(curltime *)0x0,true);
      uVar5 = (ulong)(((conn->bits).field_0x4 & 2) == 0);
      pcVar8 = (*Curl_cstrdup)((char *)conn->tempaddr[uVar5 * 8 + 0xe]);
      conn->hostname_resolve = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      rVar6 = Curl_resolv_timeout(data,pcVar8,conn->port,&local_38,tVar7);
      conn->dns_entry = local_38;
      if (rVar6 == CURLRESOLV_TIMEDOUT) {
        return CURLE_OPERATION_TIMEDOUT;
      }
      if (rVar6 != CURLRESOLV_PENDING) {
        if (local_38 == (Curl_dns_entry *)0x0) {
          Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                     *(undefined8 *)(conn->primary_ip + uVar5 * 0x40 + -0x68));
          return CURLE_COULDNT_RESOLVE_PROXY;
        }
        return CURLE_OK;
      }
    }
    *async = true;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  /* Resolve the name of the server or proxy */
  if(conn->bits.reuse) {
    /* We're reusing the connection - no need to resolve anything, and
       idnconvert_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;
    return CURLE_OK;
  }

  return resolve_fresh(data, conn, async);
}